

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::print_collection_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Collection *coll,uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  bool bVar3;
  uint32_t in_R9D;
  size_t idx;
  long lVar4;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string name;
  stringstream ss;
  CollectionInstance instance;
  ListEditQual local_d74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d70;
  Animatable<bool> local_d50;
  string local_d28;
  string *local_d08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d00;
  ordered_dict<tinyusdz::CollectionInstance> local_ce0;
  stringstream local_c98 [16];
  ostream local_c88 [112];
  ios_base local_c18 [264];
  CollectionInstance local_b10;
  
  ::std::__cxx11::stringstream::stringstream(local_c98);
  if (this == (tinyusdz *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_d08 = __return_storage_ptr__;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_ce0._keys,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::CollectionInstance>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::CollectionInstance>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::CollectionInstance>_>_>
    ::_Rb_tree(&local_ce0._m._M_t,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::CollectionInstance>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::CollectionInstance>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::CollectionInstance>_>_>
                *)(this + 0x18));
    if (local_ce0._m._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      paVar1 = &local_d28.field_2;
      lVar4 = 8;
      idx = 0;
      do {
        local_d00._M_dataplus._M_p = (pointer)&local_d00.field_2;
        lVar2 = *(long *)((long)local_ce0._keys.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar4 + -8);
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d00,lVar2,
                   *(long *)((long)&((local_ce0._keys.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar4) + lVar2);
        local_b10.expansionRule._metas.interpolation.has_value_ = false;
        local_b10.expansionRule._metas.interpolation.contained =
             (storage_t<tinyusdz::Interpolation>)0x0;
        local_b10.expansionRule._metas.elementSize.has_value_ = false;
        local_b10.expansionRule._metas.elementSize.contained = (storage_t<unsigned_int>)0x0;
        local_b10.expansionRule._metas.hidden.has_value_ = false;
        local_b10.expansionRule._metas.hidden.contained = (storage_t<bool>)0x0;
        local_b10.expansionRule._metas.comment.has_value_ = false;
        local_b10.expansionRule._metas.weight.contained = (storage_t<double>)0x0;
        local_b10.expansionRule._metas.connectability.has_value_ = false;
        local_b10.expansionRule._metas.bindMaterialAs.contained._16_8_ = 0;
        local_b10.expansionRule._metas.bindMaterialAs.contained._24_8_ = 0;
        local_b10.expansionRule._metas.bindMaterialAs.contained.data.__align =
             (anon_struct_8_0_00000001_for___align)0x0;
        local_b10.expansionRule._metas.bindMaterialAs.contained._8_8_ = 0;
        local_b10.expansionRule._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             _S_red;
        local_b10.expansionRule._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        local_b10.expansionRule._metas.customData.has_value_ = false;
        local_b10.expansionRule._metas.comment.contained._32_8_ = 0;
        local_b10.expansionRule._metas.comment.contained._40_8_ = 0;
        local_b10.expansionRule._metas.comment.contained._16_8_ = 0;
        local_b10.expansionRule._metas.comment.contained._24_8_ = 0;
        local_b10.expansionRule._metas.comment.contained.data.__align =
             (anon_struct_8_0_00000001_for___align)0x0;
        local_b10.expansionRule._metas.comment.contained._8_8_ = 0;
        local_b10.expansionRule._metas.weight.has_value_ = false;
        local_b10.expansionRule._metas.customData.contained._32_8_ = 0;
        local_b10.expansionRule._metas.customData.contained._40_8_ = 0;
        local_b10.expansionRule._metas.customData.contained._16_8_ = 0;
        local_b10.expansionRule._metas.customData.contained._24_8_ = 0;
        local_b10.expansionRule._metas.customData.contained.data.__align =
             (anon_struct_8_0_00000001_for___align)0x0;
        local_b10.expansionRule._metas.customData.contained._8_8_ = 0;
        local_b10.expansionRule._metas.outputName.has_value_ = false;
        local_b10.expansionRule._metas.connectability.contained._16_8_ = 0;
        local_b10.expansionRule._metas.connectability.contained._24_8_ = 0;
        local_b10.expansionRule._metas.connectability.contained.data.__align =
             (anon_struct_8_0_00000001_for___align)0x0;
        local_b10.expansionRule._metas.connectability.contained._8_8_ = 0;
        local_b10.expansionRule._metas.renderType.has_value_ = false;
        local_b10.expansionRule._metas.outputName.contained._16_8_ = 0;
        local_b10.expansionRule._metas.outputName.contained._24_8_ = 0;
        local_b10.expansionRule._metas.outputName.contained.data.__align =
             (anon_struct_8_0_00000001_for___align)0x0;
        local_b10.expansionRule._metas.outputName.contained._8_8_ = 0;
        local_b10.expansionRule._metas.sdrMetadata.has_value_ = false;
        local_b10.expansionRule._metas.renderType.contained._16_8_ = 0;
        local_b10.expansionRule._metas.renderType.contained._24_8_ = 0;
        local_b10.expansionRule._metas.renderType.contained.data.__align =
             (anon_struct_8_0_00000001_for___align)0x0;
        local_b10.expansionRule._metas.renderType.contained._8_8_ = 0;
        local_b10.expansionRule._metas.displayName.has_value_ = false;
        local_b10.expansionRule._metas.sdrMetadata.contained._32_8_ = 0;
        local_b10.expansionRule._metas.sdrMetadata.contained._40_8_ = 0;
        local_b10.expansionRule._metas.sdrMetadata.contained._16_8_ = 0;
        local_b10.expansionRule._metas.sdrMetadata.contained._24_8_ = 0;
        local_b10.expansionRule._metas.sdrMetadata.contained.data.__align =
             (anon_struct_8_0_00000001_for___align)0x0;
        local_b10.expansionRule._metas.sdrMetadata.contained._8_8_ = 0;
        local_b10.expansionRule._metas.displayGroup.has_value_ = false;
        local_b10.expansionRule._metas.displayName.contained._16_8_ = 0;
        local_b10.expansionRule._metas.displayName.contained._24_8_ = 0;
        local_b10.expansionRule._metas.displayName.contained.data.__align =
             (anon_struct_8_0_00000001_for___align)0x0;
        local_b10.expansionRule._metas.displayName.contained._8_8_ = 0;
        local_b10.expansionRule._metas.bindMaterialAs.has_value_ = false;
        local_b10.expansionRule._metas.displayGroup.contained._16_8_ = 0;
        local_b10.expansionRule._metas.displayGroup.contained._24_8_ = 0;
        local_b10.expansionRule._metas.displayGroup.contained.data.__align =
             (anon_struct_8_0_00000001_for___align)0x0;
        local_b10.expansionRule._metas.displayGroup.contained._8_8_ = 0;
        local_b10.expansionRule._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)((long)&local_b10.expansionRule._metas.meta._M_t._M_impl + 8);
        local_b10.expansionRule._attrib.contained =
             (storage_t<tinyusdz::CollectionInstance::ExpansionRule>)0x0;
        local_b10.expansionRule._empty = false;
        local_b10.expansionRule._paths.
        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_b10.expansionRule._537_8_ = 0;
        local_b10.expansionRule._paths.
        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_b10.expansionRule._paths.
        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        local_b10.expansionRule._paths.
        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish._1_7_ = 0;
        local_b10.expansionRule._metas.stringData.
        super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b10.expansionRule._metas.stringData.
        super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b10.expansionRule._metas.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_b10.expansionRule._metas.stringData.
        super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b10.expansionRule._fallback = ExpandPrims;
        local_b10.expansionRule._blocked = false;
        local_d50._ts._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_d50._ts._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
        local_d50._ts._dirty = false;
        local_d50._ts._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d50._ts._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        local_d50._ts._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        local_d50._2_6_ = local_d50._2_6_ & 0xffffffffff00;
        local_d50._0_2_ = 0x100;
        local_b10.expansionRule._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_b10.expansionRule._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left;
        TypedAttributeWithFallback<tinyusdz::Animatable<bool>_>::TypedAttributeWithFallback
                  (&local_b10.includeRoot,&local_d50);
        if (local_d50._ts._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d50._ts._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          CONCAT71(local_d50._ts._samples.
                                   super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                   local_d50._ts._samples.
                                   super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                          (long)local_d50._ts._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_b10.includes.has_value_ = false;
        memset(&local_b10.excludes.contained,0,0x308);
        memset(&local_b10.includes.contained,0,0x309);
        bVar3 = ordered_dict<tinyusdz::CollectionInstance>::at(&local_ce0,idx,&local_b10);
        if (bVar3) {
          local_d50._0_8_ =
               &local_d50._ts._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d50,"collection","");
          if (local_d00._M_string_length != 0) {
            ::std::operator+(&local_d70,":",&local_d00);
            ::std::__cxx11::string::_M_append(&local_d50._value,(ulong)local_d70._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d70._M_dataplus._M_p != &local_d70.field_2) {
              operator_delete(local_d70._M_dataplus._M_p,local_d70.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((((local_b10.expansionRule._empty != false) ||
               (local_b10.expansionRule._attrib.has_value_ != false)) ||
              ((pointer)CONCAT71(local_b10.expansionRule._paths.
                                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                 local_b10.expansionRule._paths.
                                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_1_) !=
               local_b10.expansionRule._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_start)) || (local_b10.expansionRule._blocked == true)) {
            local_d28._M_dataplus._M_p = (pointer)paVar1;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d28,local_d50._0_8_,
                       local_d50._0_8_ +
                       (long)&(local_d50._ts._samples.
                               super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_start)->t);
            ::std::__cxx11::string::append((char *)&local_d28);
            print_typed_token_attr<tinyusdz::CollectionInstance::ExpansionRule>
                      ((string *)&local_d70,&local_b10.expansionRule,&local_d28,(uint32_t)coll);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_c88,local_d70._M_dataplus._M_p,local_d70._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d70._M_dataplus._M_p != &local_d70.field_2) {
              operator_delete(local_d70._M_dataplus._M_p,local_d70.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d28._M_dataplus._M_p != paVar1) {
              operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (((local_b10.includeRoot._empty != false) ||
              (local_b10.includeRoot._attrib.has_value_ != false)) ||
             ((local_b10.includeRoot._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_finish !=
               local_b10.includeRoot._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_start || (local_b10.includeRoot._blocked == true)))) {
            local_d28._M_dataplus._M_p = (pointer)paVar1;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d28,local_d50._0_8_,
                       local_d50._0_8_ +
                       (long)&(local_d50._ts._samples.
                               super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_start)->t);
            ::std::__cxx11::string::append((char *)&local_d28);
            print_typed_attr<bool>
                      ((string *)&local_d70,&local_b10.includeRoot,&local_d28,(uint32_t)coll);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_c88,local_d70._M_dataplus._M_p,local_d70._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d70._M_dataplus._M_p != &local_d70.field_2) {
              operator_delete(local_d70._M_dataplus._M_p,local_d70.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d28._M_dataplus._M_p != paVar1) {
              operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar3 = SUB81(&local_d28,0);
          if (local_b10.includes.has_value_ == true) {
            local_d74 = local_b10.includes.contained._240_4_;
            local_d28._M_dataplus._M_p = (pointer)paVar1;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d28,local_d50._0_8_,
                       local_d50._0_8_ +
                       (long)&(local_d50._ts._samples.
                               super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_start)->t);
            ::std::__cxx11::string::append((char *)&local_d28);
            anon_unknown_173::print_relationship
                      ((string *)&local_d70,(Relationship *)&local_b10.includes.contained,&local_d74
                       ,bVar3,(string *)((ulong)coll & 0xffffffff),in_R9D);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_c88,local_d70._M_dataplus._M_p,local_d70._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d70._M_dataplus._M_p != &local_d70.field_2) {
              operator_delete(local_d70._M_dataplus._M_p,local_d70.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d28._M_dataplus._M_p != paVar1) {
              operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (local_b10.excludes.has_value_ == true) {
            local_d74 = local_b10.excludes.contained._240_4_;
            local_d28._M_dataplus._M_p = (pointer)paVar1;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d28,local_d50._0_8_,
                       local_d50._0_8_ +
                       (long)&(local_d50._ts._samples.
                               super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_start)->t);
            ::std::__cxx11::string::append((char *)&local_d28);
            anon_unknown_173::print_relationship
                      ((string *)&local_d70,(Relationship *)&local_b10.excludes.contained,&local_d74
                       ,bVar3,(string *)((ulong)coll & 0xffffffff),in_R9D);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_c88,local_d70._M_dataplus._M_p,local_d70._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d70._M_dataplus._M_p != &local_d70.field_2) {
              operator_delete(local_d70._M_dataplus._M_p,local_d70.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d28._M_dataplus._M_p != paVar1) {
              operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((pointer *)local_d50._0_8_ !=
              &local_d50._ts._samples.
               super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
            operator_delete((void *)local_d50._0_8_,
                            CONCAT71(local_d50._ts._samples.
                                     super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                     local_d50._ts._samples.
                                     super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._0_1_) + 1);
          }
        }
        nonstd::optional_lite::optional<tinyusdz::Relationship>::~optional(&local_b10.excludes);
        nonstd::optional_lite::optional<tinyusdz::Relationship>::~optional(&local_b10.includes);
        if (local_b10.includeRoot._fallback._ts._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b10.includeRoot._fallback._ts._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b10.includeRoot._fallback._ts._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b10.includeRoot._fallback._ts._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((local_b10.includeRoot._attrib.has_value_ == true) &&
           ((void *)local_b10.includeRoot._attrib.contained._8_8_ != (void *)0x0)) {
          operator_delete((void *)local_b10.includeRoot._attrib.contained._8_8_,
                          local_b10.includeRoot._attrib.contained._24_8_ -
                          local_b10.includeRoot._attrib.contained._8_8_);
        }
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                  (&local_b10.includeRoot._paths);
        AttrMetas::~AttrMetas(&local_b10.includeRoot._metas);
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                  (&local_b10.expansionRule._paths);
        AttrMetas::~AttrMetas((AttrMetas *)&local_b10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d00._M_dataplus._M_p != &local_d00.field_2) {
          operator_delete(local_d00._M_dataplus._M_p,local_d00.field_2._M_allocated_capacity + 1);
        }
        idx = idx + 1;
        lVar4 = lVar4 + 0x20;
      } while (idx < local_ce0._m._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    __return_storage_ptr__ = local_d08;
    ::std::__cxx11::stringbuf::str();
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::CollectionInstance>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::CollectionInstance>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::CollectionInstance>_>_>
    ::_M_erase(&local_ce0._m._M_t,
               (_Link_type)local_ce0._m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_ce0._keys);
  }
  ::std::__cxx11::stringstream::~stringstream(local_c98);
  ::std::ios_base::~ios_base(local_c18);
  return __return_storage_ptr__;
}

Assistant:

std::string print_collection(const Collection *coll, const uint32_t indent) {
  std::stringstream ss;

  if (!coll) {
    return std::string();
  }

  const auto &instances = coll->instances();

  for (size_t i = 0; i < instances.size(); i++) {
    std::string name = instances.keys()[i];

    CollectionInstance instance;
    if (!instances.at(i, &instance)) {
      continue;
    }

    std::string prefix = "collection";
    if (name.size()) {
      prefix += ":" + name;
    }

    if (instance.expansionRule.authored()) {
      ss << print_typed_token_attr(instance.expansionRule, prefix + ":expansionRule", indent);

    }


    if (instance.includeRoot.authored()) {
      ss << print_typed_attr(instance.includeRoot, prefix + ":includeRoot", indent);
    }

    if (instance.includes) {
      ss << print_relationship(
          instance.includes.value(),
          instance.includes.value().get_listedit_qual(),
          /* custom */ false, prefix + ":includes", indent);
        
    }

    if (instance.excludes) {
      ss << print_relationship(
          instance.excludes.value(),
          instance.excludes.value().get_listedit_qual(),
          /* custom */ false, prefix + ":excludes", indent);
        
    }
  }

  return ss.str();
}